

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  undefined4 uVar1;
  bool bVar2;
  cmMakefile *this_00;
  cmInstallSubdirectoryGenerator *this_01;
  undefined7 in_register_00000009;
  cmMakefile *subMf;
  cmStateSnapshot newSnapshot;
  allocator<char> local_7d;
  undefined4 local_7c;
  cmMakefile *local_78;
  cmStateDirectory local_70;
  cmStateSnapshot local_48;
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (!bVar2) {
    return;
  }
  local_7c = (undefined4)CONCAT71(in_register_00000009,excludeFromAll);
  cmState::CreateBuildsystemDirectorySnapshot
            (&local_48,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&this->StateSnapshot);
  cmStateSnapshot::GetDirectory(&local_70,&local_48);
  cmStateDirectory::SetCurrentSource(&local_70,srcPath);
  cmStateSnapshot::GetDirectory(&local_70,&local_48);
  cmStateDirectory::SetCurrentBinary(&local_70,binPath);
  cmsys::SystemTools::MakeDirectory(binPath,(mode_t *)0x0);
  this_00 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile(this_00,this->GlobalGenerator,&local_48);
  local_78 = this_00;
  cmGlobalGenerator::AddMakefile(this->GlobalGenerator,this_00);
  if ((char)local_7c == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"EXCLUDE_FROM_ALL",&local_7d);
    bVar2 = GetPropertyAsBool(this,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) goto LAB_0019fac9;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"EXCLUDE_FROM_ALL",&local_7d);
  SetProperty(this_00,(string *)&local_70,"TRUE");
  std::__cxx11::string::~string((string *)&local_70);
LAB_0019fac9:
  if (immediate) {
    ConfigureSubDirectory(this,this_00);
  }
  else {
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
              (&this->UnConfiguredDirectories,&local_78);
    this_00 = local_78;
  }
  uVar1 = local_7c;
  this_01 = (cmInstallSubdirectoryGenerator *)operator_new(0xe8);
  cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator
            (this_01,this_00,(binPath->_M_dataplus)._M_p,SUB41(uVar1,0));
  AddInstallGenerator(this,(cmInstallGenerator *)this_01);
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll, bool immediate)
{
  // Make sure the binary directory is unique.
  if (!this->EnforceUniqueDir(srcPath, binPath)) {
    return;
  }

  cmStateSnapshot newSnapshot =
    this->GetState()->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath);

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }

  if (immediate) {
    this->ConfigureSubDirectory(subMf);
  } else {
    this->UnConfiguredDirectories.push_back(subMf);
  }

  this->AddInstallGenerator(new cmInstallSubdirectoryGenerator(
    subMf, binPath.c_str(), excludeFromAll));
}